

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O0

ssize_t __thiscall
amrex::FluxRegister::read(FluxRegister *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  FluxRegister *__nbytes_00;
  undefined4 in_register_00000034;
  bool bVar2;
  BndryRegister *br;
  int ncomp_in;
  int fine_level_in;
  IntVect ratio_in;
  IntVect *in_stack_ffffffffffffff58;
  istream *in_stack_ffffffffffffff60;
  int local_7c;
  int local_78;
  IntVect local_74;
  void *local_68;
  undefined8 local_60;
  FluxRegister *local_58;
  char *local_50;
  char *local_48;
  IntVect *local_40;
  IntVect *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_60 = CONCAT44(in_register_00000034,__fd);
  local_68 = __buf;
  local_58 = this;
  if (this->ncomp < 0) {
    local_48 = "FluxRegister::read: FluxRegister not defined";
    Abort_host((char *)this);
  }
  IntVect::IntVect(&local_74);
  amrex::operator>>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::istream::operator>>(local_68,&local_78);
  std::istream::operator>>(local_68,&local_7c);
  local_40 = &this->ratio;
  local_38 = &local_74;
  local_c = 0;
  bVar2 = true;
  __nbytes_00 = (FluxRegister *)(ulong)(uint)local_74.vect[0];
  if (local_74.vect[0] == local_40->vect[0]) {
    local_1c = 1;
    bVar2 = true;
    __nbytes_00 = (FluxRegister *)(ulong)(uint)local_74.vect[1];
    local_18 = local_40;
    if (local_74.vect[1] == (this->ratio).vect[1]) {
      local_2c = 2;
      bVar2 = local_74.vect[2] != (this->ratio).vect[2];
      __nbytes_00 = (FluxRegister *)local_40;
      local_28 = local_40;
    }
  }
  local_8 = local_40;
  if (((bVar2) || (__nbytes_00 = this, local_78 != this->fine_level)) || (local_7c != this->ncomp))
  {
    local_50 = "FluxRegister::read: predefined FluxRegister does not match the one in istream";
    Abort_host((char *)this);
  }
  sVar1 = BndryRegister::read(&this->super_BndryRegister,(int)local_60,local_68,(size_t)__nbytes_00)
  ;
  return sVar1;
}

Assistant:

void
FluxRegister::read (const std::string& name, std::istream& is)
{
    if (ncomp < 0) {
        amrex::Abort("FluxRegister::read: FluxRegister not defined");
    }

    IntVect ratio_in;
    int fine_level_in;
    int ncomp_in;

    is >> ratio_in;
    is >> fine_level_in;
    is >> ncomp_in;

    if (ratio_in != ratio || fine_level_in != fine_level || ncomp_in != ncomp) {
        amrex::Abort("FluxRegister::read: predefined FluxRegister does not match the one in istream");
    }

    BndryRegister* br = this;

    br->read(name,is);
}